

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

void __thiscall
AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>::dump
          (AttributeTK<unsigned_long,_unsigned_long,_unsigned_long> *this)

{
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  AttributeTK<unsigned_long,_unsigned_long,_unsigned_long> *in_RDI;
  int in_stack_0000000c;
  unsigned_long in_stack_00000010;
  const_iterator i;
  unsigned_long size_1;
  unsigned_long size;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  *in_stack_ffffffffffffffc8;
  _Self in_stack_ffffffffffffffd8;
  _Self in_stack_ffffffffffffffe0;
  
  dumpType((AttributeTK<unsigned_long,_unsigned_long,_unsigned_long> *)0x10a3c8);
  if ((in_RDI->type & 0xffffffff) == in_RDI->type) {
    dumpCKA(in_stack_00000010,in_stack_0000000c);
    printf("\n");
  }
  else {
    printf("overflow attribute type\n");
  }
  dumpKind((AttributeTK<unsigned_long,_unsigned_long,_unsigned_long> *)0x10a411);
  bVar1 = isBoolean(in_RDI);
  if (bVar1) {
    printf("boolean attribute\n");
    dumpBoolValue((AttributeTK<unsigned_long,_unsigned_long,_unsigned_long> *)0x10a439);
    printf("\n");
  }
  else {
    bVar1 = isInteger(in_RDI);
    if (bVar1) {
      printf("unsigned long attribute\n");
      dumpULongValue(in_RDI,(uint64_t)in_stack_ffffffffffffffc8);
      dumpCKx((uint64_t)in_stack_ffffffffffffffe0._M_node,
              (uint64_t)in_stack_ffffffffffffffd8._M_node,(int)((ulong)in_RDI >> 0x20));
      printf("\n");
    }
    else {
      bVar1 = isBinary(in_RDI);
      if (bVar1) {
        printf("byte string attribute\n");
        sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          (&in_RDI->bytestrValue);
        dumpULongValue(in_RDI,(uint64_t)in_stack_ffffffffffffffc8);
        printf("(length %lu)\n",sVar2);
        dumpBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)size_1,i._M_node._7_1_);
      }
      else {
        bVar1 = isMechSet(in_RDI);
        if (bVar1) {
          printf("mechanism set attribute\n");
          sVar3 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                  ::size((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                          *)0x10a53b);
          dumpULongValue(in_RDI,(uint64_t)in_stack_ffffffffffffffc8);
          printf("(length %lu)\n",sVar3);
          std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::begin
                    (in_stack_ffffffffffffffc8);
          while( true ) {
            std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::end
                      (in_stack_ffffffffffffffc8);
            bVar1 = std::operator!=((_Self *)&stack0xffffffffffffffe0,
                                    (_Self *)&stack0xffffffffffffffd8);
            if (!bVar1) break;
            std::_Rb_tree_const_iterator<unsigned_long>::operator*
                      ((_Rb_tree_const_iterator<unsigned_long> *)in_RDI);
            dumpULongValue(in_RDI,(uint64_t)in_stack_ffffffffffffffc8);
            std::_Rb_tree_const_iterator<unsigned_long>::operator*
                      ((_Rb_tree_const_iterator<unsigned_long> *)in_RDI);
            dumpCKM(in_stack_00000010,in_stack_0000000c);
            printf("\n");
            std::_Rb_tree_const_iterator<unsigned_long>::operator++
                      ((_Rb_tree_const_iterator<unsigned_long> *)in_RDI);
          }
        }
        else {
          printf("unknown attribute format\n");
        }
      }
    }
  }
  return;
}

Assistant:

void dump() const {
		dumpType();
		if ((sizeof(type) > 4) &&
		    ((uint64_t)((uint32_t)type) != type))
		{
			printf("overflow attribute type\n");
		}
		else
		{
			dumpCKA((unsigned long) type, 47);
			printf("\n");
		}

		dumpKind();
		if (isBoolean())
		{
			printf("boolean attribute\n");
			dumpBoolValue();
			printf("\n");
		}
		else if (isInteger())
		{
			printf("unsigned long attribute\n");
			dumpULongValue(ulongValue);
			dumpCKx(type, ulongValue, 47);
			printf("\n");
		}
		else if (isBinary())
		{
			printf("byte string attribute\n");
			I size = bytestrValue.size();
			dumpULongValue(size);
			printf("(length %lu)\n", (unsigned long) size);
			dumpBytes(bytestrValue, true);
		}
		else if (isMechSet())
		{
			printf("mechanism set attribute\n");
			I size = mechSetValue.size();
			dumpULongValue(size);
			printf("(length %lu)\n", (unsigned long) size);
			for (typename std::set<I>::const_iterator i = mechSetValue.begin(); i != mechSetValue.end(); ++i)
			{
                                dumpULongValue(*i);
                                dumpCKM(*i, 47);
                                printf("\n");
                        }
		}
		else
		{
			printf("unknown attribute format\n");
		}
	}